

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_out_prod(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  long in_RSI;
  ggml_tensor *src0;
  ggml_tensor *in_stack_00000158;
  ggml_compute_params *in_stack_00000160;
  ggml_tensor *in_stack_000001c8;
  ggml_compute_params *in_stack_000001d0;
  
  iVar1 = **(int **)(in_RSI + 0x98);
  if (iVar1 != 0) {
    if (iVar1 != 1) {
      if ((((1 < iVar1 - 2U) && (2 < iVar1 - 6U)) && (4 < iVar1 - 10U)) &&
         (((7 < iVar1 - 0x10U && (iVar1 != 0x1d)) && (iVar1 != 0x22 && iVar1 != 0x23)))) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
                   ,0xef9,"fatal error");
        return;
      }
      ggml_compute_forward_out_prod_q_f32(in_stack_00000160,in_stack_00000158);
      return;
    }
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0xef0,"fatal error");
  }
  ggml_compute_forward_out_prod_f32(in_stack_000001d0,in_stack_000001c8);
  return;
}

Assistant:

void ggml_compute_forward_out_prod(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_out_prod_q_f32(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ABORT("fatal error"); // todo
                // ggml_compute_forward_out_prod_f16_f32(params, dst);
            }
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_out_prod_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}